

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

int __thiscall
table::select_abi_cxx11_
          (table *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  long *plVar6;
  undefined4 in_register_00000034;
  long lVar7;
  column *pcVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  cols;
  string colName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  local_a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  local_78;
  long local_60;
  undefined8 *local_58;
  string local_50;
  
  lVar7 = CONCAT44(in_register_00000034,__nfds);
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar10 = *(undefined8 **)__readfds->fds_bits[4];
  puVar9 = (undefined8 *)((undefined8 *)__readfds->fds_bits[4])[1];
  if (((long)puVar9 - (long)puVar10 == 8) && (*(int *)*puVar10 == 3)) {
    plVar6 = *(long **)(lVar7 + 8);
    plVar2 = *(long **)(lVar7 + 0x10);
    if (plVar6 != plVar2) {
      paVar1 = &local_a0.first.field_2;
      do {
        pcVar8 = (column *)*plVar6;
        pcVar3 = (pcVar8->name)._M_dataplus._M_p;
        local_a0.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,pcVar3 + (pcVar8->name)._M_string_length);
        local_a0.second = pcVar8;
        std::
        vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
        ::emplace_back<std::pair<std::__cxx11::string,column*>>
                  ((vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
                    *)&local_78,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.first._M_dataplus._M_p);
        }
        plVar6 = plVar6 + 1;
      } while (plVar6 != plVar2);
    }
  }
  else if (puVar10 != puVar9) {
    paVar1 = &local_a0.first.field_2;
    local_60 = lVar7;
    local_58 = puVar9;
    do {
      if ((*(uint *)*puVar10 | 4) == 5) {
        std::__cxx11::string::string
                  ((string *)&local_50,*(char **)((uint *)*puVar10 + 10),(allocator *)&local_a0);
        plVar6 = *(long **)(lVar7 + 8);
        plVar2 = *(long **)(lVar7 + 0x10);
        if (plVar6 == plVar2) {
          pcVar8 = (column *)0x0;
        }
        else {
          do {
            pcVar8 = (column *)*plVar6;
            bVar4 = util::compareString(&pcVar8->name,&local_50);
            lVar7 = local_60;
            if (bVar4) goto LAB_0011947c;
            plVar6 = plVar6 + 1;
          } while (plVar6 != plVar2);
          pcVar8 = (column *)0x0;
        }
LAB_0011947c:
        if (pcVar8 == (column *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Column \'",8);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                              local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\' does not exist in table ",0x1a);
          local_a0.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,*(long *)(lVar7 + 0x28),
                     *(long *)(lVar7 + 0x30) + *(long *)(lVar7 + 0x28));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_a0.first._M_dataplus._M_p,local_a0.first._M_string_length
                             );
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0.first._M_dataplus._M_p);
          }
          this->_vptr_table = (_func_int **)0x0;
          (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
        }
        else {
          pcVar3 = (pcVar8->name)._M_dataplus._M_p;
          local_a0.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar3,pcVar3 + (pcVar8->name)._M_string_length);
          local_a0.second = pcVar8;
          std::
          vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
          ::emplace_back<std::pair<std::__cxx11::string,column*>>
                    ((vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
                      *)&local_78,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0.first._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        puVar9 = local_58;
        if (pcVar8 == (column *)0x0) goto LAB_001195e6;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar9);
  }
  this->_vptr_table =
       (_func_int **)
       local_78.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001195e6:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ::~vector(&local_78);
  return (int)this;
}

Assistant:

vector<pair<string, column*>> table::select(hsql::SelectStatement *stmt){

    vector<pair<string, column*>> cols;

    if(stmt->selectList->size() == 1 && (*stmt->selectList)[0]->type == hsql::kExprStar) {    // select *
        for (auto col : table_cols)
            cols.push_back(make_pair(col->name, col));
    }
    else{
        for(hsql::Expr* expr : *stmt->selectList){

            if(expr->type == hsql::kExprLiteralString || expr->type == hsql::kExprColumnRef){   // select C1,C2,...
                string colName = expr->name;
                column *col = getColumn(colName);
                if(col == NULL){
                    cout <<"Column '"<<colName<<"' does not exist in table "<<getabsName()<<endl;
                    return {};
                }else{
                    cols.push_back(make_pair(col->name, col));
                }
            }//else if(expr->type == hsql::kExprLiteralInt){
            //    cols.push_back(make_pair(to_string(expr->ival), (column*)NULL));
            //}
        }
    }
    return cols;

}